

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

size_t __thiscall
ktxValidator::validationContext::calcLevelOffset(validationContext *this,uint32_t level)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint level_00;
  size_t sVar6;
  float fVar7;
  
  if ((this->header).vkFormat == 0) {
    __assert_fail("header.vkFormat != VK_FORMAT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2cd,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  if ((this->header).supercompressionScheme == 0) {
    level_00 = this->levelCount;
    if (level < level_00) {
      uVar1 = (this->formatInfo).blockByteLength;
      if ((uVar1 & 3) != 0) {
        uVar2 = 4;
        uVar5 = uVar1;
        do {
          uVar4 = uVar5;
          uVar5 = (uint)(uVar2 % (ulong)uVar4);
          uVar2 = (ulong)uVar4;
        } while (uVar5 != 0);
        uVar1 = (uVar1 << 2) / uVar4;
      }
      fVar7 = ceilf((float)((ulong)(this->header).keyValueData.byteLength +
                            (ulong)(this->header).dataFormatDescriptor.byteLength +
                            this->levelIndexSize + 0x50) / (float)uVar1);
      fVar7 = fVar7 * (float)uVar1;
      uVar2 = (ulong)fVar7;
      sVar6 = (long)(fVar7 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
      while (level_00 = level_00 - 1, level < level_00) {
        sVar3 = calcLayerSize(this,level_00);
        uVar1 = (this->formatInfo).blockByteLength;
        if ((uVar1 & 3) != 0) {
          uVar2 = 4;
          uVar5 = uVar1;
          do {
            uVar4 = uVar5;
            uVar5 = (uint)(uVar2 % (ulong)uVar4);
            uVar2 = (ulong)uVar4;
          } while (uVar5 != 0);
          uVar1 = (uVar1 << 2) / uVar4;
        }
        fVar7 = ceilf((float)(sVar3 * this->layerCount) / (float)uVar1);
        fVar7 = fVar7 * (float)uVar1;
        uVar2 = (ulong)fVar7;
        sVar6 = sVar6 + ((long)(fVar7 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2);
      }
      return sVar6;
    }
    __assert_fail("level < levelCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2d0,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  __assert_fail("header.supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                ,0x2ce,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
}

Assistant:

size_t calcLevelOffset(uint32_t level) {
            // This function is only useful when the following 2 conditions
            // are met as otherwise we have no idea what the size of a level
            // ought to be.
            assert (header.vkFormat != VK_FORMAT_UNDEFINED);
            assert (header.supercompressionScheme == KTX_SS_NONE);

            assert (level < levelCount);
            // Calculate the expected base offset in the file
            size_t levelOffset = kvDataEndOffset();
            levelOffset
                  = padn(lcm4(formatInfo.blockByteLength), levelOffset);
            for (uint32_t i = levelCount - 1; i > level; i--) {
                size_t levelSize;
                levelSize = calcLevelSize(i);
                levelOffset
                    += padn(lcm4(formatInfo.blockByteLength), levelSize);
            }
            return levelOffset;
        }